

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigPhase.c
# Opt level: O1

int Saig_TsiCountNonXValuedRegisters(Saig_Tsim_t *p,int nPref)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  
  if (p->vNonXRegs != (Vec_Int_t *)0x0) {
    __assert_fail("p->vNonXRegs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigPhase.c"
                  ,0xe6,"int Saig_TsiCountNonXValuedRegisters(Saig_Tsim_t *, int)");
  }
  uVar1 = p->pAig->nRegs;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 0x10;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(0x40);
  pVVar4->pArray = piVar5;
  p->vNonXRegs = pVVar4;
  if (0 < (int)uVar1) {
    uVar9 = 0;
    do {
      uVar2 = p->vStates->nSize;
      uVar6 = (ulong)(uint)nPref;
      if (nPref < (int)uVar2) {
        uVar7 = uVar9 * 2 & 0x1e;
        do {
          if (nPref < 0) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pvVar3 = p->vStates->pArray[uVar6];
          iVar8 = (uint)((*(uint *)((long)pvVar3 + (ulong)(uVar9 >> 4) * 4) >> uVar7 & 1) != 0) +
                  (*(uint *)((long)pvVar3 + (ulong)(uVar9 >> 4) * 4) >> ((char)uVar7 + 1U & 0x1f) &
                  1) * 2;
          if (iVar8 == 3) goto LAB_006e4fcd;
          if (iVar8 == 0) {
            __assert_fail("Value != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigPhase.c"
                          ,0xed,"int Saig_TsiCountNonXValuedRegisters(Saig_Tsim_t *, int)");
          }
          uVar6 = uVar6 + 1;
        } while ((int)uVar6 < (int)uVar2);
        uVar6 = (ulong)uVar2;
      }
LAB_006e4fcd:
      if ((uint)uVar6 == uVar2) {
        pVVar4 = p->vNonXRegs;
        uVar2 = pVVar4->nCap;
        if (pVVar4->nSize == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (pVVar4->pArray == (int *)0x0) {
              piVar5 = (int *)malloc(0x40);
            }
            else {
              piVar5 = (int *)realloc(pVVar4->pArray,0x40);
            }
            pVVar4->pArray = piVar5;
            iVar8 = 0x10;
          }
          else {
            iVar8 = uVar2 * 2;
            if (iVar8 <= (int)uVar2) goto LAB_006e504b;
            if (pVVar4->pArray == (int *)0x0) {
              piVar5 = (int *)malloc((ulong)uVar2 << 3);
            }
            else {
              piVar5 = (int *)realloc(pVVar4->pArray,(ulong)uVar2 << 3);
            }
            pVVar4->pArray = piVar5;
          }
          if (piVar5 == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          pVVar4->nCap = iVar8;
        }
LAB_006e504b:
        iVar8 = pVVar4->nSize;
        pVVar4->nSize = iVar8 + 1;
        pVVar4->pArray[iVar8] = uVar9;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar1);
  }
  return p->vNonXRegs->nSize;
}

Assistant:

int Saig_TsiCountNonXValuedRegisters( Saig_Tsim_t * p, int nPref )
{
    unsigned * pState;
    int nRegs = p->pAig->nRegs;
    int Value, i, k;
    assert( p->vNonXRegs == NULL );
    p->vNonXRegs = Vec_IntAlloc( 10 );
    for ( i = 0; i < nRegs; i++ )
    {
        Vec_PtrForEachEntryStart( unsigned *, p->vStates, pState, k, nPref )
        {
            Value = (Abc_InfoHasBit( pState, 2 * i + 1 ) << 1) | Abc_InfoHasBit( pState, 2 * i );
            assert( Value != 0 );
            if ( Value == SAIG_XVSX )
                break;
        }
        if ( k == Vec_PtrSize(p->vStates) )
            Vec_IntPush( p->vNonXRegs, i );
    }
    return Vec_IntSize(p->vNonXRegs);
}